

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O0

void __thiscall OpenMD::NPA::moveB(NPA *this)

{
  bool bVar1;
  StuntDouble *this_00;
  ulong uVar2;
  iterator *in_RDI;
  StuntDouble **ppSVar3;
  int k;
  RealType mass;
  Vector3d frc;
  Vector3d vel;
  Vector3d sc;
  Vector3d ji;
  Vector3d Tb;
  int index;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  Vector3<double> *in_stack_fffffffffffffe18;
  StuntDouble *in_stack_fffffffffffffe20;
  StuntDouble *in_stack_fffffffffffffe28;
  SimInfo *in_stack_fffffffffffffe40;
  Rattle *in_stack_fffffffffffffea0;
  StuntDouble *in_stack_fffffffffffffea8;
  Thermo *in_stack_fffffffffffffef0;
  int local_e4;
  undefined1 local_78 [76];
  int local_2c;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x209523);
  Vector3<double>::Vector3((Vector3<double> *)0x209530);
  Vector3<double>::Vector3((Vector3<double> *)0x20953d);
  Vector3<double>::Vector3((Vector3<double> *)0x20954a);
  Vector3<double>::Vector3((Vector3<double> *)0x209557);
  (**(code **)((_Base_ptr)in_RDI->_M_current + 6))();
  local_2c = 0;
  local_20 = SimInfo::beginMolecule(in_stack_fffffffffffffe40,(MoleculeIterator *)in_RDI);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject((Molecule *)in_stack_fffffffffffffe40,in_RDI);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffe28);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0x2d),(long)local_2c);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffe20);
      if (bVar1) {
        StuntDouble::getJ(in_stack_fffffffffffffe28);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (in_RDI + 0x30),(long)local_2c);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      local_2c = local_2c + 1;
      local_28 = Molecule::nextIntegrableObject((Molecule *)in_stack_fffffffffffffe40,in_RDI);
    }
    local_20 = SimInfo::nextMolecule(in_stack_fffffffffffffe40,(MoleculeIterator *)in_RDI);
  }
  ppSVar3 = (StuntDouble **)Thermo::getVolume((Thermo *)in_stack_fffffffffffffe20);
  in_RDI[0x25]._M_current = ppSVar3;
  for (local_e4 = 0; local_e4 < *(int *)&in_RDI[0x40]._M_current; local_e4 = local_e4 + 1) {
    ppSVar3 = (StuntDouble **)Thermo::getTemperature((Thermo *)in_stack_fffffffffffffe40);
    in_RDI[0x23]._M_current = ppSVar3;
    ppSVar3 = (StuntDouble **)Thermo::getPressure(in_stack_fffffffffffffef0);
    in_RDI[0x24]._M_current = ppSVar3;
    (*(code *)in_RDI->_M_current[0x16])();
    (*(code *)in_RDI->_M_current[0x13])();
    local_2c = 0;
    local_20 = SimInfo::beginMolecule(in_stack_fffffffffffffe40,(MoleculeIterator *)in_RDI);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginIntegrableObject((Molecule *)in_stack_fffffffffffffe40,in_RDI);
      while (local_28 != (StuntDouble *)0x0) {
        StuntDouble::getFrc(in_stack_fffffffffffffe28);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        StuntDouble::getMass(local_28);
        (*(code *)in_RDI->_M_current[0x11])(in_RDI,local_78,local_2c);
        this_00 = (StuntDouble *)
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              *)(in_RDI + 0x2d),(long)local_2c);
        OpenMD::operator*((double)in_stack_fffffffffffffe28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffe20);
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffe28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffe20);
        OpenMD::operator*((double)in_stack_fffffffffffffe28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffe20);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffe28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffe20);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffe28,
                   (Vector<double,_3U> *)in_stack_fffffffffffffe20);
        StuntDouble::setVel(this_00,(Vector3d *)in_stack_fffffffffffffe28);
        bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffe20);
        if (bVar1) {
          in_stack_fffffffffffffe20 = local_28;
          StuntDouble::getTrq(in_stack_fffffffffffffe28);
          StuntDouble::lab2Body(in_stack_fffffffffffffea8,(Vector3d *)in_stack_fffffffffffffea0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe28 =
               (StuntDouble *)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)(in_RDI + 0x30),(long)local_2c);
          OpenMD::operator*((double)in_stack_fffffffffffffe28,
                            (Vector<double,_3U> *)in_stack_fffffffffffffe20);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffe28,
                            (Vector<double,_3U> *)in_stack_fffffffffffffe20);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffe28,
                     (Vector<double,_3U> *)in_stack_fffffffffffffe20);
          StuntDouble::setJ(this_00,(Vector3d *)in_stack_fffffffffffffe28);
        }
        local_2c = local_2c + 1;
        local_28 = Molecule::nextIntegrableObject((Molecule *)in_stack_fffffffffffffe40,in_RDI);
      }
      local_20 = SimInfo::nextMolecule(in_stack_fffffffffffffe40,(MoleculeIterator *)in_RDI);
    }
    Rattle::constraintB(in_stack_fffffffffffffea0);
    uVar2 = (*(code *)in_RDI->_M_current[0x14])();
    if ((uVar2 & 1) != 0) break;
  }
  (**(code **)&(*in_RDI[0x12]._M_current)->localIndex_)();
  (*(code *)in_RDI->_M_current[0x19])();
  return;
}

Assistant:

void NPA::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    instaVol = thermo.getVolume();
    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb;

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if (this->etaConverged()) break;
    }

    flucQ_->moveB();
    saveEta();
  }